

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmNinjaTargetGenerator::WriteTargetDependInfo
          (cmNinjaTargetGenerator *this,string *lang,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  cmTarget *this_00;
  pointer pcVar3;
  cmGeneratorTarget *pcVar4;
  cmSourceFile *this_01;
  pointer puVar5;
  cmInstallGenerator *pcVar6;
  _Base_ptr p_Var7;
  cmInstallExportGenerator *this_02;
  pointer puVar8;
  cmExportBuildFileGenerator *pcVar9;
  String *pSVar10;
  pointer ppcVar11;
  _func_int **__s2;
  pointer pbVar12;
  pointer puVar13;
  int iVar14;
  uint uVar15;
  Value *pVVar16;
  string *psVar17;
  cmGlobalNinjaGenerator *pcVar18;
  cmFileSet *this_03;
  string *psVar19;
  mapped_type *ppcVar20;
  cmInstallFileSetGenerator *this_04;
  iterator iVar21;
  Value *pVVar22;
  Value *pVVar23;
  undefined8 uVar24;
  cmInstallCxxModuleBmiGenerator *pcVar25;
  _Rb_tree_header *p_Var26;
  _Base_ptr p_Var27;
  vector<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
  *pvVar28;
  pointer ppcVar29;
  _Base_ptr p_Var30;
  _Base_ptr p_Var31;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *entry;
  pointer cge;
  pointer puVar32;
  cmInstallCxxModuleBmiGenerator *this_05;
  pointer ppcVar33;
  pointer ppcVar34;
  pointer puVar35;
  char *value;
  _Alloc_hider _Var36;
  long lVar37;
  ulong uVar38;
  unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *ig_1;
  string *i;
  pointer path;
  pointer ppcVar39;
  undefined1 *puVar40;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  static_string_view sVar41;
  string tdin;
  string export_name;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>_>_>
  sf_map;
  Value fs_dest;
  string fs_type;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  Value tdi;
  string mod_dir;
  long *local_340;
  long local_338;
  long local_330 [2];
  string *local_320;
  string *local_318;
  cmGeneratedFileStream tdif;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  fileEntries;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_file_sets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  directoryEntries;
  
  Json::Value::Value(&tdi,objectValue);
  Json::Value::Value((Value *)&tdif,lang);
  pVVar16 = Json::Value::operator[](&tdi,"language");
  Json::Value::operator=(pVVar16,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  pcVar2 = (this->super_cmCommonTargetGenerator).Makefile;
  tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ =
       (lang->_M_dataplus)._M_p;
  tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ =
       lang->_M_string_length;
  tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)0x6;
  tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
       (long)"The CMAKE_" + 4;
  tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ = 0xc;
  tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ =
       (long)"CMAKE_CUDA_COMPILER_ID" + 10;
  views._M_len = 3;
  views._M_array = (iterator)&tdif;
  cmCatViews_abi_cxx11_((string *)&sf_map,views);
  psVar17 = cmMakefile::GetSafeDefinition(pcVar2,(string *)&sf_map);
  Json::Value::Value((Value *)&tdin,psVar17);
  pVVar16 = Json::Value::operator[](&tdi,"compiler-id");
  Json::Value::operator=(pVVar16,(Value *)&tdin);
  Json::Value::~Value((Value *)&tdin);
  if ((_Base_ptr *)sf_map._M_t._M_impl._0_8_ !=
      &sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)sf_map._M_t._M_impl._0_8_,
                    (ulong)((long)&(sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  mod_dir._M_dataplus._M_p = (pointer)&mod_dir.field_2;
  mod_dir._M_string_length = 0;
  mod_dir.field_2._M_local_buf[0] = '\0';
  iVar14 = std::__cxx11::string::compare((char *)lang);
  if (iVar14 == 0) {
    pcVar4 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    psVar17 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_
                        ((this->super_cmCommonTargetGenerator).Makefile);
    cmGeneratorTarget::GetFortranModuleDirectory((string *)&tdif,pcVar4,psVar17);
    std::__cxx11::string::operator=((string *)&mod_dir,(string *)&tdif);
    uVar24 = tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_;
    _Var36._M_p = (pointer)tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                           _vptr_basic_ostream;
    if (tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
        != (_func_int **)
           &tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
LAB_00405ca3:
      operator_delete(_Var36._M_p,uVar24 + 1);
    }
  }
  else {
    iVar14 = std::__cxx11::string::compare((char *)lang);
    if (iVar14 == 0) {
      pcVar18 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
      cmsys::SystemTools::CollapseFullPath
                (&tdin,&((this->super_cmCommonTargetGenerator).GeneratorTarget)->ObjectDirectory);
      (*(pcVar18->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
        [0x16])(&tdif,pcVar18,&tdin,config);
      std::__cxx11::string::operator=((string *)&mod_dir,(string *)&tdif);
      if (tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
          != (_func_int **)
             &tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream,
                        tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _16_8_ + 1);
      }
      uVar24 = tdin.field_2._M_allocated_capacity;
      _Var36._M_p = tdin._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tdin._M_dataplus._M_p != &tdin.field_2) goto LAB_00405ca3;
    }
  }
  if (mod_dir._M_string_length == 0) {
    cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((this->super_cmCommonTargetGenerator).Makefile)
    ;
    std::__cxx11::string::_M_assign((string *)&mod_dir);
  }
  Json::Value::Value((Value *)&tdif,&mod_dir);
  pVVar16 = Json::Value::operator[](&tdi,"module-dir");
  Json::Value::operator=(pVVar16,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  iVar14 = std::__cxx11::string::compare((char *)lang);
  if (iVar14 == 0) {
    pcVar2 = (this->super_cmCommonTargetGenerator).Makefile;
    paVar1 = &tdin.field_2;
    tdin._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&tdin,"CMAKE_Fortran_SUBMODULE_SEP","");
    psVar17 = cmMakefile::GetSafeDefinition(pcVar2,&tdin);
    Json::Value::Value((Value *)&tdif,psVar17);
    pVVar16 = Json::Value::operator[](&tdi,"submodule-sep");
    Json::Value::operator=(pVVar16,(Value *)&tdif);
    Json::Value::~Value((Value *)&tdif);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tdin._M_dataplus._M_p != paVar1) {
      operator_delete(tdin._M_dataplus._M_p,tdin.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = (this->super_cmCommonTargetGenerator).Makefile;
    tdin._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&tdin,"CMAKE_Fortran_SUBMODULE_EXT","");
    psVar17 = cmMakefile::GetSafeDefinition(pcVar2,&tdin);
    Json::Value::Value((Value *)&tdif,psVar17);
    pVVar16 = Json::Value::operator[](&tdi,"submodule-ext");
    Json::Value::operator=(pVVar16,(Value *)&tdif);
    Json::Value::~Value((Value *)&tdif);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tdin._M_dataplus._M_p != paVar1) {
      operator_delete(tdin._M_dataplus._M_p,tdin.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::string::compare((char *)lang);
  }
  psVar17 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                      ((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value((Value *)&tdif,psVar17);
  pVVar16 = Json::Value::operator[](&tdi,"dir-cur-bld");
  Json::Value::operator=(pVVar16,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  psVar17 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                      ((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value((Value *)&tdif,psVar17);
  pVVar16 = Json::Value::operator[](&tdi,"dir-cur-src");
  Json::Value::operator=(pVVar16,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  psVar17 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_
                      ((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value((Value *)&tdif,psVar17);
  pVVar16 = Json::Value::operator[](&tdi,"dir-top-bld");
  Json::Value::operator=(pVVar16,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  psVar17 = cmMakefile::GetHomeDirectory_abi_cxx11_((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value((Value *)&tdif,psVar17);
  pVVar16 = Json::Value::operator[](&tdi,"dir-top-src");
  Json::Value::operator=(pVVar16,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  Json::Value::Value((Value *)&tdif,arrayValue);
  pVVar16 = Json::Value::operator[](&tdi,"include-dirs");
  pVVar16 = Json::Value::operator=(pVVar16,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmLocalGenerator::GetIncludeDirectories
            ((cmLocalGenerator *)this->LocalGenerator,&includes,
             (this->super_cmCommonTargetGenerator).GeneratorTarget,lang,config);
  pbVar12 = includes.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (includes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      includes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    path = includes.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar18 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
      psVar17 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar18,path);
      Json::Value::Value((Value *)&tdif,psVar17);
      Json::Value::append(pVVar16,(Value *)&tdif);
      Json::Value::~Value((Value *)&tdif);
      path = path + 1;
    } while (path != pbVar12);
  }
  Json::Value::Value((Value *)&tdif,arrayValue);
  pVVar16 = Json::Value::operator[](&tdi,"linked-target-dirs");
  pVVar16 = Json::Value::operator=(pVVar16,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  cmCommonTargetGenerator::GetLinkedTargetDirectories
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&tdin,&this->super_cmCommonTargetGenerator,config);
  pSVar10 = (String *)CONCAT44(tdin._M_string_length._4_4_,(undefined4)tdin._M_string_length);
  if ((String *)tdin._M_dataplus._M_p != pSVar10) {
    _Var36 = tdin._M_dataplus;
    do {
      Json::Value::Value((Value *)&tdif,(String *)_Var36._M_p);
      Json::Value::append(pVVar16,(Value *)&tdif);
      Json::Value::~Value((Value *)&tdif);
      _Var36._M_p = _Var36._M_p + 0x20;
    } while ((String *)_Var36._M_p != pSVar10);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&tdin);
  this_00 = ((this->super_cmCommonTargetGenerator).GeneratorTarget)->Target;
  cmTarget::GetAllFileSetNames_abi_cxx11_(&all_file_sets,this_00);
  Json::Value::Value((Value *)&tdif,objectValue);
  pVVar16 = Json::Value::operator[](&tdi,"cxx-modules");
  pVVar16 = Json::Value::operator=(pVVar16,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  local_318 = all_file_sets.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (all_file_sets.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      all_file_sets.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar17 = all_file_sets.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      this_03 = cmTarget::GetFileSet(this_00,psVar17);
      if (this_03 == (cmFileSet *)0x0) {
        pcVar2 = (this->super_cmCommonTargetGenerator).Makefile;
        psVar19 = cmTarget::GetName_abi_cxx11_(this_00);
        tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ =
             (psVar19->_M_dataplus)._M_p;
        tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ =
             psVar19->_M_string_length;
        tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)0x8;
        tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
             (long)"\nTarget \"" + 1;
        tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ = 0x1f;
        tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ =
             anon_var_dwarf_17e76ad;
        tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._56_8_ =
             (psVar17->_M_dataplus)._M_p;
        tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._48_8_ =
             psVar17->_M_string_length;
        tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._64_8_ = 0x18;
        tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._72_8_ =
             anon_var_dwarf_17e76c7;
        views_00._M_len = 5;
        views_00._M_array = (iterator)&tdif;
        cmCatViews_abi_cxx11_(&tdin,views_00);
        cmMakefile::IssueMessage(pcVar2,INTERNAL_ERROR,&tdin);
        uVar24 = tdin.field_2._M_allocated_capacity;
        _Var36 = tdin._M_dataplus;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)tdin._M_dataplus._M_p != &tdin.field_2) goto LAB_00406ab1;
      }
      else {
        fs_type._M_dataplus._M_p = (pointer)&fs_type.field_2;
        pcVar3 = (this_03->Type)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&fs_type,pcVar3,pcVar3 + (this_03->Type)._M_string_length);
        if ((fs_type._M_string_length == 0xb) &&
           (*(long *)(fs_type._M_dataplus._M_p + 3) == 0x53454c55444f4d5f &&
            *(long *)fs_type._M_dataplus._M_p == 0x55444f4d5f585843)) {
          cmFileSet::CompileFileEntries(&fileEntries,this_03);
          cmFileSet::CompileDirectoryEntries(&directoryEntries,this_03);
          pcVar4 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
          local_320 = psVar17;
          cmFileSet::EvaluateDirectoryEntries
                    (&directories,this_03,&directoryEntries,pcVar4->LocalGenerator,config,pcVar4,
                     (cmGeneratorExpressionDAGChecker *)0x0);
          puVar13 = fileEntries.
                    super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          tdin._M_string_length._0_4_ = 0;
          tdin.field_2._M_allocated_capacity = 0;
          tdin.field_2._8_8_ = &tdin._M_string_length;
          for (cge = fileEntries.
                     super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; cge != puVar13; cge = cge + 1) {
            pcVar4 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
            cmFileSet::EvaluateFileEntry
                      (this_03,&directories,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        *)&tdin,cge,pcVar4->LocalGenerator,config,pcVar4,
                       (cmGeneratorExpressionDAGChecker *)0x0);
          }
          sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &sf_map._M_t._M_impl.super__Rb_tree_header._M_header;
          sf_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          objectSources.
          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          objectSources.
          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          objectSources.
          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          cmGeneratorTarget::GetObjectSources
                    ((this->super_cmCommonTargetGenerator).GeneratorTarget,&objectSources,config);
          ppcVar11 = objectSources.
                     super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          for (ppcVar34 = objectSources.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; ppcVar34 != ppcVar11;
              ppcVar34 = ppcVar34 + 1) {
            this_01 = *ppcVar34;
            psVar17 = cmSourceFile::GetFullPath_abi_cxx11_(this_01);
            fs_dest.value_.string_ = (char *)&fs_dest.comments_;
            pcVar3 = (psVar17->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&fs_dest,pcVar3,pcVar3 + psVar17->_M_string_length);
            if (fs_dest._8_8_ == 0) {
              pcVar2 = (this->super_cmCommonTargetGenerator).Makefile;
              psVar17 = cmTarget::GetName_abi_cxx11_(this_00);
              tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ =
                   (psVar17->_M_dataplus)._M_p;
              tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ =
                   psVar17->_M_string_length;
              tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream = (_func_int **)0x8;
              tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
                   (long)"\nTarget \"" + 1;
              tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ = 0x23;
              tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ =
                   anon_var_dwarf_17e804b;
              views_01._M_len = 3;
              views_01._M_array = (iterator)&tdif;
              cmCatViews_abi_cxx11_(&export_name,views_01);
              cmMakefile::IssueMessage(pcVar2,INTERNAL_ERROR,&export_name);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)export_name._M_dataplus._M_p != &export_name.field_2) {
                operator_delete(export_name._M_dataplus._M_p,
                                export_name.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              ppcVar20 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>_>_>
                         ::operator[](&sf_map,(key_type *)&fs_dest);
              *ppcVar20 = this_01;
            }
            if (fs_dest.value_ != &fs_dest.comments_) {
              operator_delete(fs_dest.value_.string_,
                              (long)fs_dest.comments_.ptr_._M_t.
                                    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                    .
                                    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                    ._M_head_impl + 1);
            }
          }
          if (objectSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(objectSources.
                            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)objectSources.
                                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)objectSources.
                                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          Json::Value::Value(&fs_dest,nullValue);
          pcVar2 = (this->super_cmCommonTargetGenerator).Makefile;
          puVar5 = (pcVar2->InstallGenerators).
                   super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (puVar32 = (pcVar2->InstallGenerators).
                         super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; puVar32 != puVar5;
              puVar32 = puVar32 + 1) {
            pcVar6 = (puVar32->_M_t).
                     super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
                     .super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl;
            if ((((pcVar6 != (cmInstallGenerator *)0x0) &&
                 (this_04 = (cmInstallFileSetGenerator *)
                            __dynamic_cast(pcVar6,&cmInstallGenerator::typeinfo,
                                           &cmInstallFileSetGenerator::typeinfo,0),
                 this_04 != (cmInstallFileSetGenerator *)0x0)) &&
                (this_04->Target == (this->super_cmCommonTargetGenerator).GeneratorTarget)) &&
               (this_04->FileSet == this_03)) {
              cmInstallFileSetGenerator::GetDestination(&export_name,this_04,config);
              Json::Value::Value((Value *)&tdif,&export_name);
              Json::Value::operator=(&fs_dest,(Value *)&tdif);
              Json::Value::~Value((Value *)&tdif);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)export_name._M_dataplus._M_p != &export_name.field_2) {
                operator_delete(export_name._M_dataplus._M_p,
                                export_name.field_2._M_allocated_capacity + 1);
              }
            }
          }
          if ((size_type *)tdin.field_2._8_8_ != &tdin._M_string_length) {
            uVar24 = tdin.field_2._8_8_;
            do {
              p_Var27 = *(_Base_ptr *)(uVar24 + 0x40);
              p_Var31 = ((_Rb_tree_node_base *)(uVar24 + 0x40))->_M_parent;
              if (p_Var27 != p_Var31) {
                do {
                  iVar21 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>_>_>
                           ::find(&sf_map._M_t,(key_type *)p_Var27);
                  if ((_Rb_tree_header *)iVar21._M_node ==
                      &sf_map._M_t._M_impl.super__Rb_tree_header) {
                    pcVar2 = (this->super_cmCommonTargetGenerator).Makefile;
                    psVar17 = cmTarget::GetName_abi_cxx11_(this_00);
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ =
                         (psVar17->_M_dataplus)._M_p;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ =
                         psVar17->_M_string_length;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream = (_func_int **)0x8;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
                         (long)"\nTarget \"" + 1;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ =
                         0x13;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ =
                         anon_var_dwarf_17e8066;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._56_4_ =
                         p_Var27->_M_color;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._60_4_ =
                         *(undefined4 *)&p_Var27->field_0x4;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._48_8_ =
                         p_Var27->_M_parent;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._64_8_ =
                         0x32;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._72_8_ =
                         anon_var_dwarf_17e8073;
                    views_02._M_len = 5;
                    views_02._M_array = (iterator)&tdif;
                    cmCatViews_abi_cxx11_(&export_name,views_02);
                    cmMakefile::IssueMessage(pcVar2,INTERNAL_ERROR,&export_name);
                  }
                  else if (*(cmSourceFile **)(iVar21._M_node + 2) == (cmSourceFile *)0x0) {
                    pcVar2 = (this->super_cmCommonTargetGenerator).Makefile;
                    psVar17 = cmTarget::GetName_abi_cxx11_(this_00);
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ =
                         (psVar17->_M_dataplus)._M_p;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ =
                         psVar17->_M_string_length;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream = (_func_int **)0x8;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
                         (long)"\nTarget \"" + 1;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ =
                         0x13;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ =
                         anon_var_dwarf_17e8066;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._56_4_ =
                         p_Var27->_M_color;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._60_4_ =
                         *(undefined4 *)&p_Var27->field_0x4;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._48_8_ =
                         p_Var27->_M_parent;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._64_8_ =
                         0x26;
                    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._72_8_ =
                         anon_var_dwarf_17e808e;
                    views_03._M_len = 5;
                    views_03._M_array = (iterator)&tdif;
                    cmCatViews_abi_cxx11_(&export_name,views_03);
                    cmMakefile::IssueMessage(pcVar2,INTERNAL_ERROR,&export_name);
                  }
                  else {
                    GetObjectFilePath(&export_name,this,*(cmSourceFile **)(iVar21._M_node + 2),
                                      config);
                    Json::Value::Value((Value *)&tdif,objectValue);
                    pVVar22 = Json::Value::operator[](pVVar16,&export_name);
                    pVVar22 = Json::Value::operator=(pVVar22,(Value *)&tdif);
                    Json::Value::~Value((Value *)&tdif);
                    Json::Value::Value((Value *)&tdif,(String *)p_Var27);
                    pVVar23 = Json::Value::operator[](pVVar22,"source");
                    Json::Value::operator=(pVVar23,(Value *)&tdif);
                    Json::Value::~Value((Value *)&tdif);
                    Json::Value::Value((Value *)&tdif,(String *)(uVar24 + 0x20));
                    pVVar23 = Json::Value::operator[](pVVar22,"relative-directory");
                    Json::Value::operator=(pVVar23,(Value *)&tdif);
                    Json::Value::~Value((Value *)&tdif);
                    Json::Value::Value((Value *)&tdif,&this_03->Name);
                    pVVar23 = Json::Value::operator[](pVVar22,"name");
                    Json::Value::operator=(pVVar23,(Value *)&tdif);
                    Json::Value::~Value((Value *)&tdif);
                    Json::Value::Value((Value *)&tdif,&this_03->Type);
                    pVVar23 = Json::Value::operator[](pVVar22,"type");
                    Json::Value::operator=(pVVar23,(Value *)&tdif);
                    Json::Value::~Value((Value *)&tdif);
                    sVar41 = cmFileSetVisibilityToName(this_03->Visibility);
                    objectSources.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start =
                         (pointer)&objectSources.
                                   super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&objectSources,sVar41.super_string_view._M_str,
                               sVar41.super_string_view._M_str + sVar41.super_string_view._M_len);
                    Json::Value::Value((Value *)&tdif,(String *)&objectSources);
                    pVVar23 = Json::Value::operator[](pVVar22,"visibility");
                    Json::Value::operator=(pVVar23,(Value *)&tdif);
                    Json::Value::~Value((Value *)&tdif);
                    if (objectSources.
                        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_start !=
                        (pointer)&objectSources.
                                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      operator_delete(objectSources.
                                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)objectSources.
                                            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
                    }
                    pVVar22 = Json::Value::operator[](pVVar22,"destination");
                    Json::Value::operator=(pVVar22,&fs_dest);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)export_name._M_dataplus._M_p != &export_name.field_2) {
                    operator_delete(export_name._M_dataplus._M_p,
                                    export_name.field_2._M_allocated_capacity + 1);
                  }
                  p_Var27 = p_Var27 + 1;
                } while (p_Var27 != p_Var31);
              }
              uVar24 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar24);
            } while ((size_type *)uVar24 != &tdin._M_string_length);
          }
          Json::Value::~Value(&fs_dest);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>_>_>
          ::~_Rb_tree(&sf_map._M_t);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                       *)&tdin);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&directories);
          std::
          vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
          ::~vector(&directoryEntries);
          std::
          vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
          ::~vector(&fileEntries);
          psVar17 = local_320;
        }
        uVar24 = fs_type.field_2._M_allocated_capacity;
        _Var36._M_p = fs_type._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fs_type._M_dataplus._M_p != &fs_type.field_2) {
LAB_00406ab1:
          operator_delete(_Var36._M_p,uVar24 + 1);
        }
      }
      psVar17 = psVar17 + 1;
    } while (psVar17 != local_318);
  }
  Json::Value::Value((Value *)&tdif,config);
  pVVar16 = Json::Value::operator[](&tdi,"config");
  Json::Value::operator=(pVVar16,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  Json::Value::Value((Value *)&tdif,arrayValue);
  pVVar16 = Json::Value::operator[](&tdi,"exports");
  pVVar16 = Json::Value::operator=(pVVar16,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  cmGeneratorTarget::GetExportName_abi_cxx11_
            (&export_name,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  pcVar2 = (this->super_cmCommonTargetGenerator).Makefile;
  puVar32 = (pcVar2->InstallGenerators).
            super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar5 = (pcVar2->InstallGenerators).
           super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar32 != puVar5) {
    pcVar4 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    this_05 = (cmInstallCxxModuleBmiGenerator *)0x0;
    do {
      pcVar6 = (puVar32->_M_t).
               super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
               .super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl;
      if (((pcVar6 == (cmInstallGenerator *)0x0) ||
          (pcVar25 = (cmInstallCxxModuleBmiGenerator *)
                     __dynamic_cast(pcVar6,&cmInstallGenerator::typeinfo,
                                    &cmInstallCxxModuleBmiGenerator::typeinfo,0),
          pcVar25 == (cmInstallCxxModuleBmiGenerator *)0x0)) || (pcVar25->Target != pcVar4)) {
        pcVar25 = this_05;
      }
      this_05 = pcVar25;
      puVar32 = puVar32 + 1;
    } while (puVar32 != puVar5);
    if (this_05 != (cmInstallCxxModuleBmiGenerator *)0x0) {
      Json::Value::Value((Value *)&tdif,objectValue);
      Json::Value::Value((Value *)&tdin,&this_05->FilePermissions);
      pVVar22 = Json::Value::operator[]((Value *)&tdif,"permissions");
      Json::Value::operator=(pVVar22,(Value *)&tdin);
      Json::Value::~Value((Value *)&tdin);
      cmInstallCxxModuleBmiGenerator::GetDestination((string *)&sf_map,this_05,config);
      Json::Value::Value((Value *)&tdin,(String *)&sf_map);
      pVVar22 = Json::Value::operator[]((Value *)&tdif,"destination");
      Json::Value::operator=(pVVar22,(Value *)&tdin);
      Json::Value::~Value((Value *)&tdin);
      if ((_Base_ptr *)sf_map._M_t._M_impl._0_8_ !=
          &sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)sf_map._M_t._M_impl._0_8_,
                        (ulong)((long)&(sf_map._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      uVar15 = (this_05->super_cmInstallGenerator).Message - MessageAlways;
      if (uVar15 < 3) {
        value = &DAT_007822bc + *(int *)(&DAT_007822bc + (ulong)uVar15 * 4);
      }
      else {
        value = "";
      }
      Json::Value::Value((Value *)&tdin,value);
      pVVar22 = Json::Value::operator[]((Value *)&tdif,"message-level");
      Json::Value::operator=(pVVar22,(Value *)&tdin);
      Json::Value::~Value((Value *)&tdin);
      cmInstallCxxModuleBmiGenerator::GetScriptLocation((string *)&sf_map,this_05,config);
      Json::Value::Value((Value *)&tdin,(String *)&sf_map);
      pVVar22 = Json::Value::operator[]((Value *)&tdif,"script-location");
      Json::Value::operator=(pVVar22,(Value *)&tdin);
      Json::Value::~Value((Value *)&tdin);
      if ((_Base_ptr *)sf_map._M_t._M_impl._0_8_ !=
          &sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)sf_map._M_t._M_impl._0_8_,
                        (ulong)((long)&(sf_map._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      pVVar22 = Json::Value::operator[](&tdi,"bmi-installation");
      Json::Value::operator=(pVVar22,(Value *)&tdif);
      goto LAB_00406dc0;
    }
  }
  Json::Value::Value((Value *)&tdif,nullValue);
  pVVar22 = Json::Value::operator[](&tdi,"bmi-installation");
  Json::Value::operator=(pVVar22,(Value *)&tdif);
LAB_00406dc0:
  Json::Value::~Value((Value *)&tdif);
  pcVar18 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  p_Var27 = (pcVar18->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.ExportSets.
            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
            ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var26 = &(pcVar18->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.ExportSets.
             super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
             ._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var27 != p_Var26) {
    do {
      p_Var31 = *(_Base_ptr *)(p_Var27 + 2);
      p_Var7 = p_Var27[2]._M_parent;
      pcVar4 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      uVar38 = (long)p_Var7 - (long)p_Var31;
      if (0 < (long)uVar38 >> 5) {
        p_Var30 = (_Base_ptr)((long)&p_Var31->_M_color + (uVar38 & 0xffffffffffffffe0));
        lVar37 = ((long)uVar38 >> 5) + 1;
        p_Var31 = (_Base_ptr)&p_Var31->_M_left;
        do {
          if (*(cmGeneratorTarget **)(p_Var31[-1]._M_left + 1) == pcVar4) {
            p_Var31 = (_Base_ptr)&p_Var31[-1]._M_left;
            goto LAB_00406ed8;
          }
          if (*(cmGeneratorTarget **)(p_Var31[-1]._M_right + 1) == pcVar4) {
            p_Var31 = (_Base_ptr)&p_Var31[-1]._M_right;
            goto LAB_00406ed8;
          }
          if (*(cmGeneratorTarget **)(*(long *)p_Var31 + 0x20) == pcVar4) goto LAB_00406ed8;
          if (*(cmGeneratorTarget **)(p_Var31->_M_parent + 1) == pcVar4) {
            p_Var31 = (_Base_ptr)&p_Var31->_M_parent;
            goto LAB_00406ed8;
          }
          lVar37 = lVar37 + -1;
          p_Var31 = p_Var31 + 1;
        } while (1 < lVar37);
        uVar38 = (long)p_Var7 - (long)p_Var30;
        p_Var31 = p_Var30;
      }
      lVar37 = (long)uVar38 >> 3;
      if (lVar37 == 1) {
LAB_00406eb8:
        if (*(cmGeneratorTarget **)(*(long *)p_Var31 + 0x20) != pcVar4) {
          p_Var31 = p_Var7;
        }
LAB_00406ed8:
        if (p_Var31 != p_Var7) {
          p_Var7 = *(_Base_ptr *)(p_Var27 + 4);
          for (p_Var31 = p_Var27[3]._M_right; p_Var31 != p_Var7;
              p_Var31 = (_Base_ptr)&p_Var31->_M_parent) {
            this_02 = *(cmInstallExportGenerator **)p_Var31;
            Json::Value::Value((Value *)&tdif,objectValue);
            sf_map._M_t._M_impl._0_8_ =
                 &sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            pcVar3 = (this_02->CxxModulesDirectory)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&sf_map,pcVar3,
                       pcVar3 + (this_02->CxxModulesDirectory)._M_string_length);
            cmInstallExportGenerator::GetTempDir_abi_cxx11_((string *)&fs_dest,this_02);
            Json::Value::Value((Value *)&tdin,&this_02->Namespace);
            pVVar22 = Json::Value::operator[]((Value *)&tdif,"namespace");
            Json::Value::operator=(pVVar22,(Value *)&tdin);
            Json::Value::~Value((Value *)&tdin);
            Json::Value::Value((Value *)&tdin,&export_name);
            pVVar22 = Json::Value::operator[]((Value *)&tdif,"export-name");
            Json::Value::operator=(pVVar22,(Value *)&tdin);
            Json::Value::~Value((Value *)&tdin);
            Json::Value::Value((Value *)&tdin,&(this_02->super_cmInstallGenerator).Destination);
            pVVar22 = Json::Value::operator[]((Value *)&tdif,"destination");
            Json::Value::operator=(pVVar22,(Value *)&tdin);
            Json::Value::~Value((Value *)&tdin);
            Json::Value::Value((Value *)&tdin,(String *)&sf_map);
            pVVar22 = Json::Value::operator[]((Value *)&tdif,"cxx-module-info-dir");
            Json::Value::operator=(pVVar22,(Value *)&tdin);
            Json::Value::~Value((Value *)&tdin);
            Json::Value::Value((Value *)&tdin,(String *)&fs_dest);
            pVVar22 = Json::Value::operator[]((Value *)&tdif,"export-prefix");
            Json::Value::operator=(pVVar22,(Value *)&tdin);
            Json::Value::~Value((Value *)&tdin);
            Json::Value::Value((Value *)&tdin,true);
            pVVar22 = Json::Value::operator[]((Value *)&tdif,"install");
            Json::Value::operator=(pVVar22,(Value *)&tdin);
            Json::Value::~Value((Value *)&tdin);
            Json::Value::append(pVVar16,(Value *)&tdif);
            if (fs_dest.value_ != &fs_dest.comments_) {
              operator_delete(fs_dest.value_.string_,
                              (long)fs_dest.comments_.ptr_._M_t.
                                    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                    .
                                    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                    ._M_head_impl + 1);
            }
            if ((_Base_ptr *)sf_map._M_t._M_impl._0_8_ !=
                &sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)sf_map._M_t._M_impl._0_8_,
                              (ulong)((long)&(sf_map._M_t._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
            Json::Value::~Value((Value *)&tdif);
          }
        }
      }
      else {
        if (lVar37 == 2) {
LAB_00406eab:
          if (*(cmGeneratorTarget **)(*(long *)p_Var31 + 0x20) != pcVar4) {
            p_Var31 = (_Base_ptr)&p_Var31->_M_parent;
            goto LAB_00406eb8;
          }
          goto LAB_00406ed8;
        }
        if (lVar37 == 3) {
          if (*(cmGeneratorTarget **)(*(long *)p_Var31 + 0x20) != pcVar4) {
            p_Var31 = (_Base_ptr)&p_Var31->_M_parent;
            goto LAB_00406eab;
          }
          goto LAB_00406ed8;
        }
      }
      p_Var27 = (_Base_ptr)std::_Rb_tree_increment(p_Var27);
    } while ((_Rb_tree_header *)p_Var27 != p_Var26);
  }
  pvVar28 = cmMakefile::GetExportBuildFileGenerators((this->super_cmCommonTargetGenerator).Makefile)
  ;
  puVar35 = (pvVar28->
            super__Vector_base<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  puVar8 = (pvVar28->
           super__Vector_base<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar35 == puVar8) {
      GetTargetDependInfoPath(&tdin,this,lang,config);
      cmGeneratedFileStream::cmGeneratedFileStream(&tdif,&tdin,false,None);
      Json::operator<<((OStream *)&tdif,&tdi);
      cmGeneratedFileStream::~cmGeneratedFileStream(&tdif);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tdin._M_dataplus._M_p != &tdin.field_2) {
        operator_delete(tdin._M_dataplus._M_p,tdin.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)export_name._M_dataplus._M_p != &export_name.field_2) {
        operator_delete(export_name._M_dataplus._M_p,export_name.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&all_file_sets);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&includes);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)mod_dir._M_dataplus._M_p != &mod_dir.field_2) {
        operator_delete(mod_dir._M_dataplus._M_p,
                        CONCAT71(mod_dir.field_2._M_allocated_capacity._1_7_,
                                 mod_dir.field_2._M_local_buf[0]) + 1);
      }
      Json::Value::~Value(&tdi);
      return;
    }
    puVar40 = &tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
    objectSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    objectSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    objectSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmExportBuildFileGenerator::GetTargets
              ((puVar35->_M_t).
               super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
               .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>._M_head_impl,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&objectSources);
    psVar17 = cmGeneratorTarget::GetName_abi_cxx11_
                        ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    ppcVar11 = objectSources.
               super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    ppcVar34 = objectSources.
               super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    local_340 = local_330;
    pcVar3 = (psVar17->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_340,pcVar3,pcVar3 + psVar17->_M_string_length);
    fs_type._M_dataplus._M_p = (pointer)&fs_type.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&fs_type,local_340,local_338 + (long)local_340);
    fs_dest.value_ = (ValueHolder)&fs_dest.comments_;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&fs_dest,fs_type._M_dataplus._M_p,
               fs_type._M_dataplus._M_p + fs_type._M_string_length);
    sf_map._M_t._M_impl._0_8_ = &sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sf_map,fs_dest.value_.int_,fs_dest.value_.string_ + fs_dest._8_8_);
    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)puVar40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&tdif,sf_map._M_t._M_impl._0_8_,
               CONCAT44(sf_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                        sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color) +
               sf_map._M_t._M_impl._0_8_);
    tdin._M_dataplus._M_p = (pointer)&tdin.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&tdin,
               tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
               _vptr_basic_ostream,
               tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ +
               (long)tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                     _vptr_basic_ostream);
    if (tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
        != (_func_int **)puVar40) {
      operator_delete(tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream,
                      tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_
                      + 1);
    }
    tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)puVar40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&tdif,tdin._M_dataplus._M_p,
               tdin._M_dataplus._M_p +
               CONCAT44(tdin._M_string_length._4_4_,(undefined4)tdin._M_string_length));
    uVar24 = tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_;
    __s2 = tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
           _vptr_basic_ostream;
    uVar38 = (long)ppcVar11 - (long)ppcVar34;
    ppcVar29 = ppcVar34;
    if (0 < (long)uVar38 >> 7) {
      ppcVar29 = (pointer)((uVar38 & 0xffffffffffffff80) + (long)ppcVar34);
      lVar37 = ((long)uVar38 >> 7) + 1;
      ppcVar39 = ppcVar34 + 8;
      do {
        if (ppcVar39[-7] == (cmSourceFile *)uVar24) {
          if (uVar24 == 0) {
            ppcVar33 = ppcVar39 + -8;
            goto LAB_00407477;
          }
          iVar14 = bcmp(ppcVar39[-8],__s2,uVar24);
          ppcVar33 = ppcVar34;
          if (iVar14 == 0) goto LAB_00407477;
          if (ppcVar39[-3] == (cmSourceFile *)uVar24) {
            ppcVar33 = ppcVar39 + -4;
            goto LAB_00407323;
          }
        }
        else if (ppcVar39[-3] == (cmSourceFile *)uVar24) {
          if (uVar24 == 0) {
            ppcVar33 = ppcVar39 + -4;
            goto LAB_00407477;
          }
          ppcVar33 = ppcVar34 + 4;
LAB_00407323:
          iVar14 = bcmp(*ppcVar33,__s2,uVar24);
          if (iVar14 == 0) goto LAB_00407477;
        }
        if (ppcVar39[1] == (cmSourceFile *)uVar24) {
          ppcVar33 = ppcVar39;
          if ((uVar24 == 0) || (iVar14 = bcmp(*ppcVar39,__s2,uVar24), iVar14 == 0))
          goto LAB_00407477;
          if (ppcVar39[5] == (cmSourceFile *)uVar24) {
            ppcVar33 = ppcVar39 + 4;
            goto LAB_0040737d;
          }
        }
        else if (ppcVar39[5] == (cmSourceFile *)uVar24) {
          if (uVar24 == 0) {
            ppcVar33 = ppcVar39 + 4;
            goto LAB_00407477;
          }
          ppcVar33 = ppcVar34 + 0xc;
LAB_0040737d:
          iVar14 = bcmp(*ppcVar33,__s2,uVar24);
          if (iVar14 == 0) goto LAB_00407477;
        }
        ppcVar34 = ppcVar34 + 0x10;
        lVar37 = lVar37 + -1;
        ppcVar39 = ppcVar39 + 0x10;
      } while (1 < lVar37);
      uVar38 = (long)ppcVar11 - (long)ppcVar29;
    }
    lVar37 = (long)uVar38 >> 5;
    if (lVar37 == 1) {
LAB_0040742a:
      ppcVar33 = ppcVar11;
      if (((ppcVar29[1] == (cmSourceFile *)uVar24) && (ppcVar33 = ppcVar29, uVar24 != 0)) &&
         (iVar14 = bcmp(*ppcVar29,__s2,uVar24), iVar14 != 0)) {
        ppcVar33 = ppcVar11;
      }
    }
    else {
      ppcVar33 = ppcVar29;
      if (lVar37 == 2) {
LAB_00407408:
        if ((ppcVar33[1] != (cmSourceFile *)uVar24) ||
           ((uVar24 != 0 && (iVar14 = bcmp(*ppcVar33,__s2,uVar24), iVar14 != 0)))) {
          ppcVar29 = ppcVar33 + 4;
          goto LAB_0040742a;
        }
      }
      else {
        ppcVar33 = ppcVar11;
        if ((lVar37 == 3) &&
           ((ppcVar29[1] != (cmSourceFile *)uVar24 ||
            ((ppcVar33 = ppcVar29, uVar24 != 0 &&
             (iVar14 = bcmp(*ppcVar29,__s2,uVar24), iVar14 != 0)))))) {
          ppcVar33 = ppcVar29 + 4;
          goto LAB_00407408;
        }
      }
    }
LAB_00407477:
    if (__s2 != (_func_int **)
                &tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
    {
      operator_delete(__s2,tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                           _16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tdin._M_dataplus._M_p != &tdin.field_2) {
      operator_delete(tdin._M_dataplus._M_p,tdin.field_2._M_allocated_capacity + 1);
    }
    if ((_Base_ptr *)sf_map._M_t._M_impl._0_8_ !=
        &sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)sf_map._M_t._M_impl._0_8_,
                      (ulong)((long)&(sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                                     ->_M_color + 1));
    }
    if (fs_dest.value_ != &fs_dest.comments_) {
      operator_delete(fs_dest.value_.string_,
                      (long)fs_dest.comments_.ptr_._M_t.
                            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                            .
                            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                            ._M_head_impl + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fs_type._M_dataplus._M_p != &fs_type.field_2) {
      operator_delete(fs_type._M_dataplus._M_p,fs_type.field_2._M_allocated_capacity + 1);
    }
    if (local_340 != local_330) {
      operator_delete(local_340,local_330[0] + 1);
    }
    if (ppcVar33 != ppcVar11) {
      Json::Value::Value((Value *)&tdif,objectValue);
      pcVar9 = (puVar35->_M_t).
               super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
               .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>._M_head_impl;
      sf_map._M_t._M_impl._0_8_ = &sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      _Var36._M_p = (pcVar9->super_cmExportFileGenerator).Namespace._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&sf_map,_Var36._M_p,
                 _Var36._M_p + (pcVar9->super_cmExportFileGenerator).Namespace._M_string_length);
      psVar17 = cmExportFileGenerator::GetMainExportFileName_abi_cxx11_
                          (&((puVar35->_M_t).
                             super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
                             .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>.
                            _M_head_impl)->super_cmExportFileGenerator);
      pcVar9 = (puVar35->_M_t).
               super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
               .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>._M_head_impl;
      cmsys::SystemTools::GetParentDirectory((string *)&fs_dest,psVar17);
      psVar17 = cmExportFileGenerator::GetMainExportFileName_abi_cxx11_
                          (&((puVar35->_M_t).
                             super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
                             .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>.
                            _M_head_impl)->super_cmExportFileGenerator);
      cmsys::SystemTools::GetFilenamePath(&fs_type,psVar17);
      Json::Value::Value((Value *)&tdin,(String *)&sf_map);
      pVVar22 = Json::Value::operator[]((Value *)&tdif,"namespace");
      Json::Value::operator=(pVVar22,(Value *)&tdin);
      Json::Value::~Value((Value *)&tdin);
      Json::Value::Value((Value *)&tdin,&export_name);
      pVVar22 = Json::Value::operator[]((Value *)&tdif,"export-name");
      Json::Value::operator=(pVVar22,(Value *)&tdin);
      Json::Value::~Value((Value *)&tdin);
      Json::Value::Value((Value *)&tdin,(String *)&fs_dest);
      pVVar22 = Json::Value::operator[]((Value *)&tdif,"destination");
      Json::Value::operator=(pVVar22,(Value *)&tdin);
      Json::Value::~Value((Value *)&tdin);
      Json::Value::Value((Value *)&tdin,&pcVar9->CxxModulesDirectory);
      pVVar22 = Json::Value::operator[]((Value *)&tdif,"cxx-module-info-dir");
      Json::Value::operator=(pVVar22,(Value *)&tdin);
      Json::Value::~Value((Value *)&tdin);
      Json::Value::Value((Value *)&tdin,&fs_type);
      pVVar22 = Json::Value::operator[]((Value *)&tdif,"export-prefix");
      Json::Value::operator=(pVVar22,(Value *)&tdin);
      Json::Value::~Value((Value *)&tdin);
      Json::Value::Value((Value *)&tdin,false);
      pVVar22 = Json::Value::operator[]((Value *)&tdif,"install");
      Json::Value::operator=(pVVar22,(Value *)&tdin);
      Json::Value::~Value((Value *)&tdin);
      Json::Value::append(pVVar16,(Value *)&tdif);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fs_type._M_dataplus._M_p != &fs_type.field_2) {
        operator_delete(fs_type._M_dataplus._M_p,fs_type.field_2._M_allocated_capacity + 1);
      }
      if (fs_dest.value_ != &fs_dest.comments_) {
        operator_delete(fs_dest.value_.string_,
                        (long)fs_dest.comments_.ptr_._M_t.
                              super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                              .
                              super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                              ._M_head_impl + 1);
      }
      if ((_Base_ptr *)sf_map._M_t._M_impl._0_8_ !=
          &sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)sf_map._M_t._M_impl._0_8_,
                        (ulong)((long)&(sf_map._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      Json::Value::~Value((Value *)&tdif);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&objectSources);
    puVar35 = puVar35 + 1;
  } while( true );
}

Assistant:

void cmNinjaTargetGenerator::WriteTargetDependInfo(std::string const& lang,
                                                   const std::string& config)
{
  Json::Value tdi(Json::objectValue);
  tdi["language"] = lang;
  tdi["compiler-id"] = this->Makefile->GetSafeDefinition(
    cmStrCat("CMAKE_", lang, "_COMPILER_ID"));

  std::string mod_dir;
  if (lang == "Fortran") {
    mod_dir = this->GeneratorTarget->GetFortranModuleDirectory(
      this->Makefile->GetHomeOutputDirectory());
  } else if (lang == "CXX") {
    mod_dir = this->GetGlobalGenerator()->ExpandCFGIntDir(
      cmSystemTools::CollapseFullPath(this->GeneratorTarget->ObjectDirectory),
      config);
  }
  if (mod_dir.empty()) {
    mod_dir = this->Makefile->GetCurrentBinaryDirectory();
  }
  tdi["module-dir"] = mod_dir;

  if (lang == "Fortran") {
    tdi["submodule-sep"] =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_SEP");
    tdi["submodule-ext"] =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_EXT");
  } else if (lang == "CXX") {
    // No extra information necessary.
  }

  tdi["dir-cur-bld"] = this->Makefile->GetCurrentBinaryDirectory();
  tdi["dir-cur-src"] = this->Makefile->GetCurrentSourceDirectory();
  tdi["dir-top-bld"] = this->Makefile->GetHomeOutputDirectory();
  tdi["dir-top-src"] = this->Makefile->GetHomeDirectory();

  Json::Value& tdi_include_dirs = tdi["include-dirs"] = Json::arrayValue;
  std::vector<std::string> includes;
  this->LocalGenerator->GetIncludeDirectories(includes, this->GeneratorTarget,
                                              lang, config);
  for (std::string const& i : includes) {
    // Convert the include directories the same way we do for -I flags.
    // See upstream ninja issue 1251.
    tdi_include_dirs.append(this->ConvertToNinjaPath(i));
  }

  Json::Value& tdi_linked_target_dirs = tdi["linked-target-dirs"] =
    Json::arrayValue;
  for (std::string const& l : this->GetLinkedTargetDirectories(config)) {
    tdi_linked_target_dirs.append(l);
  }

  cmTarget* tgt = this->GeneratorTarget->Target;
  auto all_file_sets = tgt->GetAllFileSetNames();
  Json::Value& tdi_cxx_module_info = tdi["cxx-modules"] = Json::objectValue;
  for (auto const& file_set_name : all_file_sets) {
    auto* file_set = tgt->GetFileSet(file_set_name);
    if (!file_set) {
      this->GetMakefile()->IssueMessage(
        MessageType::INTERNAL_ERROR,
        cmStrCat("Target \"", tgt->GetName(),
                 "\" is tracked to have file set \"", file_set_name,
                 "\", but it was not found."));
      continue;
    }
    auto fs_type = file_set->GetType();
    // We only care about C++ module sources here.
    if (fs_type != "CXX_MODULES"_s) {
      continue;
    }

    auto fileEntries = file_set->CompileFileEntries();
    auto directoryEntries = file_set->CompileDirectoryEntries();

    auto directories = file_set->EvaluateDirectoryEntries(
      directoryEntries, this->GeneratorTarget->LocalGenerator, config,
      this->GeneratorTarget);
    std::map<std::string, std::vector<std::string>> files_per_dirs;
    for (auto const& entry : fileEntries) {
      file_set->EvaluateFileEntry(directories, files_per_dirs, entry,
                                  this->GeneratorTarget->LocalGenerator,
                                  config, this->GeneratorTarget);
    }

    std::map<std::string, cmSourceFile const*> sf_map;
    {
      std::vector<cmSourceFile const*> objectSources;
      this->GeneratorTarget->GetObjectSources(objectSources, config);
      for (auto const* sf : objectSources) {
        auto full_path = sf->GetFullPath();
        if (full_path.empty()) {
          this->GetMakefile()->IssueMessage(
            MessageType::INTERNAL_ERROR,
            cmStrCat("Target \"", tgt->GetName(),
                     "\" has a full path-less source file."));
          continue;
        }
        sf_map[full_path] = sf;
      }
    }

    Json::Value fs_dest = Json::nullValue;
    for (auto const& ig : this->GetMakefile()->GetInstallGenerators()) {
      if (auto const* fsg =
            dynamic_cast<cmInstallFileSetGenerator const*>(ig.get())) {
        if (fsg->GetTarget() == this->GeneratorTarget &&
            fsg->GetFileSet() == file_set) {
          fs_dest = fsg->GetDestination(config);
          continue;
        }
      }
    }

    for (auto const& files_per_dir : files_per_dirs) {
      for (auto const& file : files_per_dir.second) {
        auto lookup = sf_map.find(file);
        if (lookup == sf_map.end()) {
          this->GetMakefile()->IssueMessage(
            MessageType::INTERNAL_ERROR,
            cmStrCat("Target \"", tgt->GetName(), "\" has source file \"",
                     file,
                     R"(" which is not in any of its "FILE_SET BASE_DIRS".)"));
          continue;
        }

        auto const* sf = lookup->second;

        if (!sf) {
          this->GetMakefile()->IssueMessage(
            MessageType::INTERNAL_ERROR,
            cmStrCat("Target \"", tgt->GetName(), "\" has source file \"",
                     file, "\" which has not been tracked properly."));
          continue;
        }

        auto obj_path = this->GetObjectFilePath(sf, config);
        Json::Value& tdi_module_info = tdi_cxx_module_info[obj_path] =
          Json::objectValue;

        tdi_module_info["source"] = file;
        tdi_module_info["relative-directory"] = files_per_dir.first;
        tdi_module_info["name"] = file_set->GetName();
        tdi_module_info["type"] = file_set->GetType();
        tdi_module_info["visibility"] =
          std::string(cmFileSetVisibilityToName(file_set->GetVisibility()));
        tdi_module_info["destination"] = fs_dest;
      }
    }
  }

  tdi["config"] = config;

  // Add information about the export sets that this target is a member of.
  Json::Value& tdi_exports = tdi["exports"] = Json::arrayValue;
  std::string export_name = this->GeneratorTarget->GetExportName();

  cmInstallCxxModuleBmiGenerator const* bmi_gen = nullptr;
  for (auto const& ig : this->GetMakefile()->GetInstallGenerators()) {
    if (auto const* bmig =
          dynamic_cast<cmInstallCxxModuleBmiGenerator const*>(ig.get())) {
      if (bmig->GetTarget() == this->GeneratorTarget) {
        bmi_gen = bmig;
        continue;
      }
    }
  }
  if (bmi_gen) {
    Json::Value tdi_bmi_info = Json::objectValue;

    tdi_bmi_info["permissions"] = bmi_gen->GetFilePermissions();
    tdi_bmi_info["destination"] = bmi_gen->GetDestination(config);
    const char* msg_level = "";
    switch (bmi_gen->GetMessageLevel()) {
      case cmInstallGenerator::MessageDefault:
        break;
      case cmInstallGenerator::MessageAlways:
        msg_level = "MESSAGE_ALWAYS";
        break;
      case cmInstallGenerator::MessageLazy:
        msg_level = "MESSAGE_LAZY";
        break;
      case cmInstallGenerator::MessageNever:
        msg_level = "MESSAGE_NEVER";
        break;
    }
    tdi_bmi_info["message-level"] = msg_level;
    tdi_bmi_info["script-location"] = bmi_gen->GetScriptLocation(config);

    tdi["bmi-installation"] = tdi_bmi_info;
  } else {
    tdi["bmi-installation"] = Json::nullValue;
  }

  auto const& all_install_exports =
    this->GetGlobalGenerator()->GetExportSets();
  for (auto const& exp : all_install_exports) {
    // Ignore exports sets which are not for this target.
    auto const& targets = exp.second.GetTargetExports();
    auto tgt_export =
      std::find_if(targets.begin(), targets.end(),
                   [this](std::unique_ptr<cmTargetExport> const& te) {
                     return te->Target == this->GeneratorTarget;
                   });
    if (tgt_export == targets.end()) {
      continue;
    }

    auto const* installs = exp.second.GetInstallations();
    for (auto const* install : *installs) {
      Json::Value tdi_export_info = Json::objectValue;

      auto const& ns = install->GetNamespace();
      auto const& dest = install->GetDestination();
      auto const& cxxm_dir = install->GetCxxModuleDirectory();
      auto const& export_prefix = install->GetTempDir();

      tdi_export_info["namespace"] = ns;
      tdi_export_info["export-name"] = export_name;
      tdi_export_info["destination"] = dest;
      tdi_export_info["cxx-module-info-dir"] = cxxm_dir;
      tdi_export_info["export-prefix"] = export_prefix;
      tdi_export_info["install"] = true;

      tdi_exports.append(tdi_export_info);
    }
  }

  auto const& all_build_exports =
    this->GetMakefile()->GetExportBuildFileGenerators();
  for (auto const& exp : all_build_exports) {
    std::vector<std::string> targets;
    exp->GetTargets(targets);

    // Ignore exports sets which are not for this target.
    auto const& name = this->GeneratorTarget->GetName();
    bool has_current_target =
      std::any_of(targets.begin(), targets.end(),
                  [name](std::string const& tname) { return tname == name; });
    if (!has_current_target) {
      continue;
    }

    Json::Value tdi_export_info = Json::objectValue;

    auto const& ns = exp->GetNamespace();
    auto const& main_fn = exp->GetMainExportFileName();
    auto const& cxxm_dir = exp->GetCxxModuleDirectory();
    auto dest = cmsys::SystemTools::GetParentDirectory(main_fn);
    auto const& export_prefix =
      cmSystemTools::GetFilenamePath(exp->GetMainExportFileName());

    tdi_export_info["namespace"] = ns;
    tdi_export_info["export-name"] = export_name;
    tdi_export_info["destination"] = dest;
    tdi_export_info["cxx-module-info-dir"] = cxxm_dir;
    tdi_export_info["export-prefix"] = export_prefix;
    tdi_export_info["install"] = false;

    tdi_exports.append(tdi_export_info);
  }

  std::string const tdin = this->GetTargetDependInfoPath(lang, config);
  cmGeneratedFileStream tdif(tdin);
  tdif << tdi;
}